

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O3

int ReadLine(bool SplitByColon)

{
  uint32_t uVar1;
  uint32_t uVar2;
  pointer pTVar3;
  CStringsList *pCVar4;
  int iVar5;
  
  pCVar4 = lijstp;
  pTVar3 = sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((IsRunning != 0) && (lijst != 0)) {
    iVar5 = 0;
    if ((lijstp != (CStringsList *)0x0) && (iVar5 = 0, lijstp->string != (char *)0x0)) {
      if (sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
          super__Vector_impl_data._M_start ==
          sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        __assert_fail("!sourcePosStack.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/sjasm/sjio.cpp"
                      ,0x50d,"int ReadLine(bool)");
      }
      sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
      super__Vector_impl_data._M_finish[-1].colEnd = (lijstp->source).colEnd;
      uVar1 = (pCVar4->source).line;
      uVar2 = (pCVar4->source).colBegin;
      pTVar3[-1].filename = (pCVar4->source).filename;
      pTVar3[-1].line = uVar1;
      pCVar4 = lijstp;
      pTVar3[-1].colBegin = uVar2;
      strcpy(line,lijstp->string);
      substitutedLine = line;
      eolComment = (char *)0x0;
      lijstp = pCVar4->next;
      iVar5 = 1;
    }
    return iVar5;
  }
  iVar5 = ReadLineNoMacro(SplitByColon);
  return iVar5;
}

Assistant:

int ReadLine(bool SplitByColon) {
	if (IsRunning && lijst) {		// read MACRO lines, if macro is being emitted
		if (!lijstp || !lijstp->string) return 0;
		assert(!sourcePosStack.empty());
		sourcePosStack.back() = lijstp->source;
		STRCPY(line, LINEMAX, lijstp->string);
		substitutedLine = line;		// reset substituted listing
		eolComment = NULL;			// reset end of line comment
		lijstp = lijstp->next;
		return 1;
	}
	return ReadLineNoMacro(SplitByColon);
}